

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O3

void __thiscall netbase_tests::subnet_test::test_method(subnet_test *this)

{
  readonly_property65 rVar1;
  bool bVar2;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string file_65;
  const_string file_66;
  const_string file_67;
  const_string file_68;
  const_string file_69;
  const_string file_70;
  const_string file_71;
  const_string file_72;
  const_string file_73;
  const_string file_74;
  const_string file_75;
  const_string file_76;
  const_string file_77;
  const_string file_78;
  const_string file_79;
  const_string file_80;
  const_string file_81;
  const_string file_82;
  const_string file_83;
  const_string file_84;
  const_string file_85;
  const_string file_86;
  const_string file_87;
  const_string file_88;
  const_string file_89;
  const_string file_90;
  const_string file_91;
  const_string file_92;
  const_string file_93;
  const_string file_94;
  const_string file_95;
  const_string file_96;
  const_string file_97;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string msg_65;
  const_string msg_66;
  const_string msg_67;
  const_string msg_68;
  const_string msg_69;
  const_string msg_70;
  const_string msg_71;
  const_string msg_72;
  const_string msg_73;
  const_string msg_74;
  const_string msg_75;
  const_string msg_76;
  const_string msg_77;
  const_string msg_78;
  const_string msg_79;
  const_string msg_80;
  const_string msg_81;
  const_string msg_82;
  const_string msg_83;
  const_string msg_84;
  const_string msg_85;
  const_string msg_86;
  const_string msg_87;
  const_string msg_88;
  const_string msg_89;
  const_string msg_90;
  const_string msg_91;
  const_string msg_92;
  const_string msg_93;
  const_string msg_94;
  const_string msg_95;
  const_string msg_96;
  const_string msg_97;
  check_type cVar6;
  char *local_1168;
  char *local_1160;
  undefined1 *local_1158;
  undefined1 *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  undefined1 *local_1128;
  undefined1 *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_1100;
  undefined1 *local_10f8;
  undefined1 *local_10f0;
  char *local_10e8;
  char *local_10e0;
  undefined1 *local_10d8;
  undefined1 *local_10d0;
  char *local_10c8;
  char *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  undefined1 *local_1078;
  undefined1 *local_1070;
  char *local_1068;
  char *local_1060;
  undefined1 *local_1058;
  undefined1 *local_1050;
  char *local_1048;
  char *local_1040;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  undefined1 *local_1018;
  undefined1 *local_1010;
  char *local_1008;
  char *local_1000;
  undefined1 *local_ff8;
  undefined1 *local_ff0;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  undefined1 *local_fb8;
  undefined1 *local_fb0;
  char *local_fa8;
  char *local_fa0;
  undefined1 *local_f98;
  undefined1 *local_f90;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  undefined1 *local_f58;
  undefined1 *local_f50;
  char *local_f48;
  char *local_f40;
  undefined1 *local_f38;
  undefined1 *local_f30;
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  char *local_ec8;
  char *local_ec0;
  undefined1 *local_eb8;
  undefined1 *local_eb0;
  char *local_ea8;
  char *local_ea0;
  undefined1 *local_e98;
  undefined1 *local_e90;
  char *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  char *local_e28;
  char *local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  undefined1 *local_d58;
  undefined1 *local_d50;
  char *local_d48;
  char *local_d40;
  undefined1 *local_d38;
  undefined1 *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  undefined1 *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  undefined1 *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  undefined1 *local_b88;
  undefined1 *local_b80;
  char *local_b78;
  char *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  undefined1 *local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  string *local_188;
  string *local_180;
  char *local_178;
  assertion_result local_170;
  string *local_158;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_120;
  direct_or_indirect local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  direct_or_indirect local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  direct_or_indirect local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  uint8_t local_b0 [8];
  uint8_t auStack_a8 [8];
  bool local_a0;
  direct_or_indirect local_98;
  uint local_88;
  lazy_ostream *local_80;
  uint8_t local_78 [8];
  uint8_t auStack_70 [8];
  undefined1 local_68;
  direct_or_indirect local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_1030 = (undefined1 *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9a;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.0/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_58);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.0/255.255.255.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_f0);
  _cVar6 = 0x4da719;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator==((CSubNet *)&local_98.indirect_contents,(CSubNet *)&local_d0);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.3.0/24\") == LookupSubNet(\"1.2.3.0/255.255.255.0\")";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_1b8,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9b;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.0/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_58);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.4.0/255.255.255.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_f0);
  _cVar6 = 0x4da8e8;
  bVar2 = ::operator==((CSubNet *)&local_98.indirect_contents,(CSubNet *)&local_d0);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.3.0/24\") != LookupSubNet(\"1.2.4.0/255.255.255.0\")";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_1e8,0x9b);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x9c;
  file_01.m_begin = (iterator)&local_1f8;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_208,
             msg_01);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4daabb;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.3.0/24\").Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_210 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_218,0x9c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_228;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_02);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.2.0/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dac8b;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"1.2.2.0/24\").Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_240 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_248,0x9d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9e;
  file_03.m_begin = (iterator)&local_258;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_268,
             msg_03);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.4","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dae5d;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.3.4\").Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_270 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_278,0x9e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9f;
  file_04.m_begin = (iterator)&local_288;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_298,
             msg_04);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.4/32","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db02d;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.3.4/32\").Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2a0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_2a8,0x9f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa0;
  file_05.m_begin = (iterator)&local_2b8;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2c8,
             msg_05);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.4","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"5.6.7.8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db1fd;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"1.2.3.4\").Match(ResolveIP(\"5.6.7.8\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2d0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_2d8,0xa0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa1;
  file_06.m_begin = (iterator)&local_2e8;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
             msg_06);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.4/32","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"5.6.7.8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db3cf;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"1.2.3.4/32\").Match(ResolveIP(\"5.6.7.8\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_300 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_308,0xa1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa2;
  file_07.m_begin = (iterator)&local_318;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_328,
             msg_07);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"::ffff:127.0.0.1","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db5a1;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"::ffff:127.0.0.1\").Match(ResolveIP(\"127.0.0.1\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_330 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_338,0xa2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xa3;
  file_08.m_begin = (iterator)&local_348;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_358,
             msg_08);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db771;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1:2:3:4:5:6:7:8\").Match(ResolveIP(\"1:2:3:4:5:6:7:8\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_360 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_368,0xa3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xa4;
  file_09.m_begin = (iterator)&local_378;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_388,
             msg_09);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:9","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4db941;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"1:2:3:4:5:6:7:8\").Match(ResolveIP(\"1:2:3:4:5:6:7:9\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_390 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_398,0xa4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa5;
  file_10.m_begin = (iterator)&local_3a8;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b8,
             msg_10);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:0/112","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:1234","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dbb13;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1:2:3:4:5:6:7:0/112\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))"
  ;
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3c0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_3c8,0xa5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa6;
  file_11.m_begin = (iterator)&local_3d8;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e8,
             msg_11);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"192.168.0.1/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"192.168.0.2","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dbce3;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"192.168.0.1/24\").Match(ResolveIP(\"192.168.0.2\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3f0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_3f8,0xa6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xa7;
  file_12.m_begin = (iterator)&local_408;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_418,
             msg_12);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"192.168.0.20/29","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"192.168.0.18","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dbeb3;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"192.168.0.20/29\").Match(ResolveIP(\"192.168.0.18\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_420 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_428,0xa7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xa8;
  file_13.m_begin = (iterator)&local_438;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_448,
             msg_13);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.2.1/24","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.2.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc083;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.2.1/24\").Match(ResolveIP(\"1.2.2.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_450 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_458,0xa8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xa9;
  file_14.m_begin = (iterator)&local_468;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_478,
             msg_14);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.2.110/31","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.2.111","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc253;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.2.110/31\").Match(ResolveIP(\"1.2.2.111\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_480 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_488,0xa9);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xaa;
  file_15.m_begin = (iterator)&local_498;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4a8,
             msg_15);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.2.20/26","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.2.63","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc423;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"1.2.2.20/26\").Match(ResolveIP(\"1.2.2.63\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_4b8,0xaa);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xac;
  file_16.m_begin = (iterator)&local_4c8;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4d8,
             msg_16);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"::/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:1234","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc5f3;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "LookupSubNet(\"::/0\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_4e8,0xac);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xae;
  file_17.m_begin = (iterator)&local_4f8;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_508,
             msg_17);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"::/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"::","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc7c3;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"::\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_510 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_518,0xae);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xaf;
  file_18.m_begin = (iterator)&local_528;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_538,
             msg_18);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"::/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"0.0.0.0","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dc995;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"0.0.0.0\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_540 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_548,0xaf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb1;
  file_19.m_begin = (iterator)&local_558;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_568,
             msg_19);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"::/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dcb67;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"::/0\").Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_570 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_578,0xb1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xb3;
  file_20.m_begin = (iterator)&local_588;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_598,
             msg_20);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0.0.0.0/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:1234","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dcd39;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"0.0.0.0/0\").Match(ResolveIP(\"1:2:3:4:5:6:7:1234\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5a0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_5a8,0xb3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xb5;
  file_21.m_begin = (iterator)&local_5b8;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5c8,
             msg_21);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  _cVar6 = 0x4dcee8;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  local_110.direct[0] = !bVar2;
  local_110._8_8_ = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_130._0_8_ = "!CSubNet().Match(ResolveIP(\"1.2.3.4\"))";
  local_130._8_8_ = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5d0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_e0._8_8_ = (assertion_result *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_110,(lazy_ostream *)&local_f0,1,0,WARN,_cVar6,
             (size_t)&local_5d8,0xb5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xb6;
  file_22.m_begin = (iterator)&local_5e8;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5f8,
             msg_22);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"4.5.6.7","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dd08d;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"\").Match(ResolveIP(\"4.5.6.7\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_600 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_608,0xb6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xb7;
  file_23.m_begin = (iterator)&local_618;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_628,
             msg_23);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bloop","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"0.0.0.0","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dd25f;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"bloop\").Match(ResolveIP(\"0.0.0.0\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_630 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_638,0xb7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0xb8;
  file_24.m_begin = (iterator)&local_648;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_658,
             msg_24);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"bloop","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"hab","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  _cVar6 = 0x4dd431;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!LookupSubNet(\"bloop\").Match(ResolveIP(\"hab\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_660 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_668,0xb8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0xba;
  file_25.m_begin = (iterator)&local_678;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_688,
             msg_25);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4dd5d7;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "LookupSubNet(\"1.2.3.0/0\").IsValid()";
  local_110._8_8_ = (long)"LookupSubNet(\"1.2.3.0/0\").IsValid()" + 0x23;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_690 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_698,0xba);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xbb;
  file_26.m_begin = (iterator)&local_6a8;
  msg_26.m_end = pvVar5;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6b8,
             msg_26);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/-1","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4dd725;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/-1\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/-1\").IsValid()" + 0x25;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6c0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_6c8,0xbb);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xbc;
  file_27.m_begin = (iterator)&local_6d8;
  msg_27.m_end = pvVar5;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6e8,
             msg_27);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/32","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4dd875;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "LookupSubNet(\"1.2.3.0/32\").IsValid()";
  local_110._8_8_ = (long)"LookupSubNet(\"1.2.3.0/32\").IsValid()" + 0x24;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_6f0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_6f8,0xbc);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xbd;
  file_28.m_begin = (iterator)&local_708;
  msg_28.m_end = pvVar5;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_718,
             msg_28);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/33","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4dd9c3;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/33\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/33\").IsValid()" + 0x25;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_720 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_728,0xbd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xbe;
  file_29.m_begin = (iterator)&local_738;
  msg_29.m_end = pvVar5;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_748,
             msg_29);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1.2.3.0/300","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4ddb13;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"1.2.3.0/300\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"1.2.3.0/300\").IsValid()" + 0x26;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_750 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_758,0xbe);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xbf;
  file_30.m_begin = (iterator)&local_768;
  msg_30.m_end = pvVar5;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_778,
             msg_30);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8/0","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4ddc63;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/0\").IsValid()";
  local_110._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/0\").IsValid()" + 0x2b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_780 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_788,0xbf);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = &DAT_000000c0;
  file_31.m_begin = (iterator)&local_798;
  msg_31.m_end = pvVar5;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7a8,
             msg_31);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8/33","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4dddb1;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/33\").IsValid()";
  local_110._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/33\").IsValid()" + 0x2c;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7b0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_7b8,0xc0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xc1;
  file_32.m_begin = (iterator)&local_7c8;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_7d8,
             msg_32);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8/-1","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4ddeff;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"1:2:3:4:5:6:7:8/-1\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"1:2:3:4:5:6:7:8/-1\").IsValid()" + 0x2d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7e0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_7e8,0xc1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xc2;
  file_33.m_begin = (iterator)&local_7f8;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_808,
             msg_33);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8/128","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4de04f;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "LookupSubNet(\"1:2:3:4:5:6:7:8/128\").IsValid()";
  local_110._8_8_ = (long)"LookupSubNet(\"1:2:3:4:5:6:7:8/128\").IsValid()" + 0x2d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_810 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_818,0xc2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xc3;
  file_34.m_begin = (iterator)&local_828;
  msg_34.m_end = pvVar5;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_838,
             msg_34);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"1:2:3:4:5:6:7:8/129","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4de19d;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"1:2:3:4:5:6:7:8/129\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"1:2:3:4:5:6:7:8/129\").IsValid()" + 0x2e;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_840 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_848,0xc3);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xc4;
  file_35.m_begin = (iterator)&local_858;
  msg_35.m_end = pvVar5;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_868,
             msg_35);
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"fuzzy","");
  LookupSubNet((CSubNet *)&local_98.indirect_contents,(string *)&local_d0);
  _cVar6 = 0x4de2ed;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_f0.direct[0] = !bVar2;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!LookupSubNet(\"fuzzy\").IsValid()";
  local_110._8_8_ = (long)"!LookupSubNet(\"fuzzy\").IsValid()" + 0x20;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_870 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_878,0xc4);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xc7;
  file_36.m_begin = (iterator)&local_888;
  msg_36.m_end = pvVar5;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_898,
             msg_36);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  _cVar6 = 0x4de452;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_110.direct[0] = bVar2;
  local_110._8_8_ = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_130._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).IsValid()";
  local_130._8_8_ = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8a0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_e0._8_8_ = (assertion_result *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_110,(lazy_ostream *)&local_f0,1,0,WARN,_cVar6,
             (size_t)&local_8a8,199);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xc8;
  file_37.m_begin = (iterator)&local_8b8;
  msg_37.m_end = pvVar5;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8c8,
             msg_37);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  local_110.indirect_contents.indirect = (char *)&aStack_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_f0,(string *)&local_110);
  _cVar6 = 0x4de61b;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_f0);
  local_150[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  aStack_120._8_8_ = &local_170;
  local_170._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).Match(ResolveIP(\"127.0.0.1\"))";
  local_170.m_message.px = (element_type *)0xebd235;
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8d0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)local_130,1,0,WARN,_cVar6,
             (size_t)&local_8d8,200);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if (0x10 < (uint)aStack_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
    local_f0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xc9;
  file_38.m_begin = (iterator)&local_8e8;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_8f8,
             msg_38);
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  local_110.indirect_contents.indirect = (char *)&aStack_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"127.0.0.2","");
  ResolveIP((CNetAddr *)&local_f0,(string *)&local_110);
  _cVar6 = 0x4de82b;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_f0);
  local_150[0] = !bVar2;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ = "!CSubNet(ResolveIP(\"127.0.0.1\")).Match(ResolveIP(\"127.0.0.2\"))";
  local_170.m_message.px = (element_type *)0xebd27e;
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_120._8_8_ = &local_170;
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_900 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)local_130,1,0,WARN,_cVar6,
             (size_t)&local_908,0xc9);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if (0x10 < (uint)aStack_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
    local_f0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0xca;
  file_39.m_begin = (iterator)&local_918;
  msg_39.m_end = pvVar5;
  msg_39.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_928,
             msg_39);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"127.0.0.1","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_58);
  CSubNet::ToString_abi_cxx11_((string *)&local_d0,(CSubNet *)&local_98.indirect_contents);
  _cVar6 = 0x4dea2d;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     "127.0.0.1/32");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "CSubNet(ResolveIP(\"127.0.0.1\")).ToString() == \"127.0.0.1/32\"";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_938 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_930 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = (assertion_result *)local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_938,0xca);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  CSubNet::CSubNet((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0,' ');
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0xcd;
  file_40.m_begin = (iterator)&local_948;
  msg_40.m_end = pvVar5;
  msg_40.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_958,
             msg_40);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"1.2.3.4/32");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  aStack_48._8_8_ = &local_180;
  local_180 = (string *)0xebf39d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xcd,(CNetAddr *)&local_d0,"\"1.2.3.4/32\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,'\b');
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  local_68 = local_a0;
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0xcf;
  file_41.m_begin = (iterator)&local_968;
  msg_41.m_end = pvVar5;
  msg_41.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_978,
             msg_41);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"1.0.0.0/8");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  local_180 = (string *)0xebd2d6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_180;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xcf,(CSubNet *)&local_d0,"\"1.0.0.0/8\"",(CNetAddr *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,'\0');
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_980 = "";
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0xd1;
  file_42.m_begin = (iterator)&local_988;
  msg_42.m_end = pvVar5;
  msg_42.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_998,
             msg_42);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"0.0.0.0/0");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  local_180 = (string *)0xebce5b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_180;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xd1,(CSubNet *)&local_d0,"\"0.0.0.0/0\"",(CNetAddr *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"255.255.255.255","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,(CNetAddr *)&local_110);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_9a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9a0 = "";
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0xd4;
  file_43.m_begin = (iterator)&local_9a8;
  msg_43.m_end = pvVar5;
  msg_43.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_9b8,
             msg_43);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"1.2.3.4/32");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  local_180 = (string *)0xebf39d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_180;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xd4,(CSubNet *)&local_d0,"\"1.2.3.4/32\"",(CNetAddr *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"255.0.0.0","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,(CNetAddr *)&local_110);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0xd6;
  file_44.m_begin = (iterator)&local_9c8;
  msg_44.m_end = pvVar5;
  msg_44.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_9d8,
             msg_44);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"1.0.0.0/8");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  local_180 = (string *)0xebd2d6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_180;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xd6,(CSubNet *)&local_d0,"\"1.0.0.0/8\"",(CNetAddr *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"0.0.0.0","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,(CNetAddr *)&local_110);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_9e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0xd8;
  file_45.m_begin = (iterator)&local_9e8;
  msg_45.m_end = pvVar5;
  msg_45.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_9f8,
             msg_45);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_
            ((string *)&local_110.indirect_contents,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_110.indirect_contents,"0.0.0.0/0");
  local_130[0] = iVar3 == 0;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_150._8_8_ = "";
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_170;
  local_180 = (string *)0xebce5b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_180;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_170._0_8_ = &local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xebf366,
             (size_t)local_150,0xd8,(CSubNet *)&local_d0,"\"0.0.0.0/0\"",(CNetAddr *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_a08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a00 = "";
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0xda;
  file_46.m_begin = (iterator)&local_a08;
  msg_46.m_end = pvVar5;
  msg_46.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_a18,
             msg_46);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58);
  _cVar6 = 0x4dfd58;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CSubNet::IsValid((CSubNet *)&local_d0);
  local_130[0] = rVar1.super_readonly_property<bool>.super_class_property<bool>.value;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).IsValid()";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_a28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a20 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_a28,0xda);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_a38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0xdb;
  file_47.m_begin = (iterator)&local_a38;
  msg_47.m_end = pvVar5;
  msg_47.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_a48,
             msg_47);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  _cVar6 = 0x4dff23;
  bVar2 = CSubNet::Match((CSubNet *)&local_d0,(CNetAddr *)&local_110);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = (string *)0xebd328;
  local_178 = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = &local_180;
  local_a58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a50 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_150,1,0,WARN,_cVar6,(size_t)&local_a58,0xdb);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_a68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a60 = "";
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0xdc;
  file_48.m_begin = (iterator)&local_a68;
  msg_48.m_end = pvVar5;
  msg_48.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_a78,
             msg_48);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"1:2:3:4:5:6:7:9","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  _cVar6 = 0x4e0133;
  bVar2 = CSubNet::Match((CSubNet *)&local_d0,(CNetAddr *)&local_110);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = (string *)0xebd372;
  local_178 = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = &local_180;
  local_a88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a80 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_150,1,0,WARN,_cVar6,(size_t)&local_a88,0xdc);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_a98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_a90 = "";
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0xdd;
  file_49.m_begin = (iterator)&local_a98;
  msg_49.m_end = pvVar5;
  msg_49.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_aa8,
             msg_49);
  local_110.indirect_contents.indirect = (char *)&aStack_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"1:2:3:4:5:6:7:8","");
  ResolveIP((CNetAddr *)&local_f0,(string *)&local_110);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_f0);
  CSubNet::ToString_abi_cxx11_((string *)&local_58,(CSubNet *)&local_d0);
  _cVar6 = 0x4e033a;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                     "1:2:3:4:5:6:7:8/128");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ = "CSubNet(ResolveIP(\"1:2:3:4:5:6:7:8\")).ToString() == \"1:2:3:4:5:6:7:8/128\"";
  local_170.m_message.px = (element_type *)0xebd406;
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_ab8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ab0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_120._8_8_ = &local_170;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)local_130,1,0,WARN,_cVar6,
             (size_t)&local_ab8,0xdd);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
    local_f0.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.indirect_contents.indirect != &aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_ac8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ac0 = "";
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0xdf;
  file_50.m_begin = (iterator)&local_ac8;
  msg_50.m_end = pvVar5;
  msg_50.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_ad8,
             msg_50);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"1.1.1.1","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"ffff::","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,(CNetAddr *)&local_110);
  _cVar6 = 0x4e053b;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_d0);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = (string *)0xebd416;
  local_178 = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = &local_180;
  local_ae8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ae0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_150,1,0,WARN,_cVar6,(size_t)&local_ae8,0xdf);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_af8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_af0 = "";
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0xe0;
  file_51.m_begin = (iterator)&local_af8;
  msg_51.m_end = pvVar5;
  msg_51.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_b08,
             msg_51);
  local_f0.indirect_contents.indirect = (char *)&aStack_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"::1","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_f0);
  local_130._0_8_ = &aStack_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"255.0.0.0","");
  ResolveIP((CNetAddr *)&local_110,(string *)local_130);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_58,(CNetAddr *)&local_110);
  _cVar6 = 0x4e0757;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_d0);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = (string *)0xebd454;
  local_178 = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = &local_180;
  local_b18 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b10 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_150,1,0,WARN,_cVar6,(size_t)&local_b18,0xe0);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_100._M_allocated_capacity._0_4_) {
    free(local_110.indirect_contents.indirect);
    local_110.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &aStack_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(aStack_e0._M_allocated_capacity + 1)
                   );
  }
  local_d0.indirect_contents.indirect = (char *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",""
            );
  ResolveIP((CNetAddr *)&local_f0,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.indirect_contents.indirect != &local_c0) {
    operator_delete(local_d0.indirect_contents.indirect,(ulong)(local_c0._M_allocated_capacity + 1))
    ;
  }
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_f0);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b20 = "";
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0xe8;
  file_52.m_begin = (iterator)&local_b28;
  msg_52.m_end = pvVar5;
  msg_52.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_b38,
             msg_52);
  _cVar6 = 0x4e09c3;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_58.direct[0] = bVar2;
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "subnet.IsValid()";
  local_110._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b40 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_c0._8_8_ = (CNetAddr *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)&local_d0,1,0,WARN,_cVar6,
             (size_t)&local_b48,0xe8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48);
  local_b58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b50 = "";
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0xe9;
  file_53.m_begin = (iterator)&local_b58;
  msg_53.m_end = pvVar5;
  msg_53.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_b68,
             msg_53);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  CNetAddr::ToStringAddr_abi_cxx11_((string *)local_150,(CNetAddr *)&local_f0);
  if (local_130._8_8_ == local_150._8_8_) {
    if ((element_type *)local_130._8_8_ == (element_type *)0x0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp((void *)local_130._0_8_,(void *)local_150._0_8_,local_130._8_8_);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_180 = (string *)0xebb79d;
  local_178 = "";
  local_c0._8_8_ = &local_158;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_188;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_188 = (string *)local_150;
  local_158 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,(size_t)&local_180,0xe9,
             (lazy_ostream *)&local_d0,"tor_addr.ToStringAddr()",(assertion_result *)&local_58);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &aStack_140) {
    operator_delete((void *)local_150._0_8_,(ulong)(aStack_140._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_b78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b70 = "";
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0xea;
  file_54.m_begin = (iterator)&local_b78;
  msg_54.m_end = pvVar5;
  msg_54.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_b88,
             msg_54);
  _cVar6 = 0x4e0cbf;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_f0);
  local_58.direct[0] = bVar2;
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "subnet.Match(tor_addr)";
  local_110._8_8_ = (long)"subnet.Match(tor_addr)" + 0x16;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_b98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_b90 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_c0._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)&local_d0,1,0,WARN,_cVar6,
             (size_t)&local_b98,0xea);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48);
  local_ba8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ba0 = "";
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0xec;
  file_55.m_begin = (iterator)&local_ba8;
  msg_55.m_end = pvVar5;
  msg_55.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_bb8,
             msg_55);
  local_58.indirect_contents.indirect = (char *)(shared_count *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion",""
            );
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  _cVar6 = 0x4e0de4;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ =
       "!subnet.Match(ResolveIP(\"kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion\"))"
  ;
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_bc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bc0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = (string *)local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_bc8,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((shared_count *)local_58.indirect_contents.indirect != (shared_count *)&aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_bd8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bd0 = "";
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0xed;
  file_56.m_begin = (iterator)&local_bd8;
  msg_56.m_end = pvVar5;
  msg_56.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_be8,
             msg_56);
  local_58.indirect_contents.indirect = (char *)(shared_count *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4","");
  ResolveIP((CNetAddr *)&local_d0,(string *)&local_58);
  _cVar6 = 0x4e0f48;
  bVar2 = CSubNet::Match((CSubNet *)&local_98.indirect_contents,(CNetAddr *)&local_d0);
  local_130[0] = !bVar2;
  local_130._8_8_ = (element_type *)0x0;
  aStack_120._M_allocated_capacity = 0;
  local_150._0_8_ = "!subnet.Match(ResolveIP(\"1.2.3.4\"))";
  local_150._8_8_ = "";
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_bf8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_bf0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_100._8_8_ = (string *)local_150;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_130,(lazy_ostream *)&local_110,1,0,WARN,_cVar6,
             (size_t)&local_bf8,0xed);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_120._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if ((shared_count *)local_58.indirect_contents.indirect != (shared_count *)&aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_c08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0xef;
  file_57.m_begin = (iterator)&local_c08;
  msg_57.m_end = pvVar5;
  msg_57.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_c18,
             msg_57);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_f0,200);
  _cVar6 = 0x4e1089;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_d0);
  local_110.direct[0] = !bVar2;
  local_110._8_8_ = (element_type *)0x0;
  aStack_100._M_allocated_capacity = 0;
  local_130._0_8_ = "!CSubNet(tor_addr, 200).IsValid()";
  local_130._8_8_ = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c20 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_48._8_8_ = (assertion_result *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_110,(lazy_ostream *)&local_58,1,0,WARN,_cVar6,
             (size_t)&local_c28,0xef);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_100);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
  }
  local_c38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c30 = "";
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0xf0;
  file_58.m_begin = (iterator)&local_c38;
  msg_58.m_end = pvVar5;
  msg_58.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_c48,
             msg_58);
  local_110.indirect_contents.indirect = (char *)(shared_count *)&aStack_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"255.0.0.0","");
  ResolveIP((CNetAddr *)&local_58,(string *)&local_110);
  CSubNet::CSubNet((CSubNet *)&local_d0,(CNetAddr *)&local_f0,(CNetAddr *)&local_58);
  _cVar6 = 0x4e11e3;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_d0);
  local_150[0] = !bVar2;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ = "!CSubNet(tor_addr, ResolveIP(\"255.0.0.0\")).IsValid()";
  local_170.m_message.px = (element_type *)0xebd595;
  local_130._8_8_ = local_130._8_8_ & 0xffffffffffffff00;
  local_130._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_120._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c50 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  aStack_120._8_8_ = &local_170;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)local_130,1,0,WARN,_cVar6,
             (size_t)&local_c58,0xf0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if (0x10 < (uint)local_c0._M_allocated_capacity._0_4_) {
    free(local_d0.indirect_contents.indirect);
    local_d0.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (uint)aStack_48._M_allocated_capacity._0_4_) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if ((shared_count *)local_110.indirect_contents.indirect != (shared_count *)&aStack_100) {
    operator_delete(local_110.indirect_contents.indirect,
                    (ulong)(aStack_100._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)(shared_count *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.255","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((shared_count *)local_58.indirect_contents.indirect != (shared_count *)&aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_c68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c60 = "";
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0xf3;
  file_59.m_begin = (iterator)&local_c68;
  msg_59.m_end = pvVar5;
  msg_59.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_c78,
             msg_59);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.4/32");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebf39d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xf3,(CSubNet *)&local_d0,"\"1.2.3.4/32\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.254","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_c88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_c80 = "";
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0xf5;
  file_60.m_begin = (iterator)&local_c88;
  msg_60.m_end = pvVar5;
  msg_60.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_c98,
             msg_60);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.4/31");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd5c6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xf5,(CSubNet *)&local_d0,"\"1.2.3.4/31\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.252","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_ca8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ca0 = "";
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0xf7;
  file_61.m_begin = (iterator)&local_ca8;
  msg_61.m_end = pvVar5;
  msg_61.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_cb8,
             msg_61);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.4/30");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd5f6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xf7,(CSubNet *)&local_d0,"\"1.2.3.4/30\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.248","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_cc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_cc0 = "";
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0xf9;
  file_62.m_begin = (iterator)&local_cc8;
  msg_62.m_end = pvVar5;
  msg_62.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_cd8,
             msg_62);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/29");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd626;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xf9,(CSubNet *)&local_d0,"\"1.2.3.0/29\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.240","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_ce8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ce0 = "";
  local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0xfb;
  file_63.m_begin = (iterator)&local_ce8;
  msg_63.m_end = pvVar5;
  msg_63.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_cf8,
             msg_63);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/28");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd656;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xfb,(CSubNet *)&local_d0,"\"1.2.3.0/28\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.224","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_d08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d00 = "";
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0xfd;
  file_64.m_begin = (iterator)&local_d08;
  msg_64.m_end = pvVar5;
  msg_64.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_d18,
             msg_64);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/27");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd686;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xfd,(CSubNet *)&local_d0,"\"1.2.3.0/27\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.192","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_d28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d20 = "";
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_65.m_end = (iterator)0xff;
  file_65.m_begin = (iterator)&local_d28;
  msg_65.m_end = pvVar5;
  msg_65.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_65,(size_t)&local_d38,
             msg_65);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/26");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd6b6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0xff,(CSubNet *)&local_d0,"\"1.2.3.0/26\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.128","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_d48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d40 = "";
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_66.m_end = (iterator)0x101;
  file_66.m_begin = (iterator)&local_d48;
  msg_66.m_end = pvVar5;
  msg_66.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_66,(size_t)&local_d58,
             msg_66);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/25");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd6e6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x101,(CSubNet *)&local_d0,"\"1.2.3.0/25\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.255.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_d68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d60 = "";
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_67.m_end = (iterator)0x103;
  file_67.m_begin = (iterator)&local_d68;
  msg_67.m_end = pvVar5;
  msg_67.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_67,(size_t)&local_d78,
             msg_67);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.3.0/24");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebc874;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x103,(CSubNet *)&local_d0,"\"1.2.3.0/24\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.254.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_d88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_d80 = "";
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_68.m_end = (iterator)0x105;
  file_68.m_begin = (iterator)&local_d88;
  msg_68.m_end = pvVar5;
  msg_68.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_68,(size_t)&local_d98,
             msg_68);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.2.0/23");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd737;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x105,(CSubNet *)&local_d0,"\"1.2.2.0/23\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.252.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_da8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_da0 = "";
  local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_db0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_69.m_end = (iterator)0x107;
  file_69.m_begin = (iterator)&local_da8;
  msg_69.m_end = pvVar5;
  msg_69.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_69,(size_t)&local_db8,
             msg_69);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/22");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd765;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x107,(CSubNet *)&local_d0,"\"1.2.0.0/22\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.248.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_dc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_dc0 = "";
  local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_70.m_end = (iterator)0x109;
  file_70.m_begin = (iterator)&local_dc8;
  msg_70.m_end = pvVar5;
  msg_70.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_70,(size_t)&local_dd8,
             msg_70);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/21");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd793;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x109,(CSubNet *)&local_d0,"\"1.2.0.0/21\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.240.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_de8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_de0 = "";
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_71.m_end = (iterator)0x10b;
  file_71.m_begin = (iterator)&local_de8;
  msg_71.m_end = pvVar5;
  msg_71.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_71,(size_t)&local_df8,
             msg_71);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/20");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd7c1;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x10b,(CSubNet *)&local_d0,"\"1.2.0.0/20\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.224.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_e08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e00 = "";
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_72.m_end = (iterator)0x10d;
  file_72.m_begin = (iterator)&local_e08;
  msg_72.m_end = pvVar5;
  msg_72.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_72,(size_t)&local_e18,
             msg_72);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/19");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd7ef;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x10d,(CSubNet *)&local_d0,"\"1.2.0.0/19\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.192.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_e28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e20 = "";
  local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_73.m_end = (iterator)0x10f;
  file_73.m_begin = (iterator)&local_e28;
  msg_73.m_end = pvVar5;
  msg_73.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_73,(size_t)&local_e38,
             msg_73);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/18");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd81d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x10f,(CSubNet *)&local_d0,"\"1.2.0.0/18\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.128.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_e48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e40 = "";
  local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_74.m_end = (iterator)0x111;
  file_74.m_begin = (iterator)&local_e48;
  msg_74.m_end = pvVar5;
  msg_74.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_74,(size_t)&local_e58,
             msg_74);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/17");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd84b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x111,(CSubNet *)&local_d0,"\"1.2.0.0/17\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_e68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e60 = "";
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_75.m_end = (iterator)0x113;
  file_75.m_begin = (iterator)&local_e68;
  msg_75.m_end = pvVar5;
  msg_75.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_75,(size_t)&local_e78,
             msg_75);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/16");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd877;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x113,(CSubNet *)&local_d0,"\"1.2.0.0/16\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.254.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_e88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_e80 = "";
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_76.m_end = (iterator)0x115;
  file_76.m_begin = (iterator)&local_e88;
  msg_76.m_end = pvVar5;
  msg_76.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_76,(size_t)&local_e98,
             msg_76);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.2.0.0/15");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd8a3;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x115,(CSubNet *)&local_d0,"\"1.2.0.0/15\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.252.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_ea8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ea0 = "";
  local_eb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_77.m_end = (iterator)0x117;
  file_77.m_begin = (iterator)&local_ea8;
  msg_77.m_end = pvVar5;
  msg_77.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_77,(size_t)&local_eb8,
             msg_77);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/14");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd8cf;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x117,(CSubNet *)&local_d0,"\"1.0.0.0/14\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.248.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_ec8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ec0 = "";
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_78.m_end = (iterator)0x119;
  file_78.m_begin = (iterator)&local_ec8;
  msg_78.m_end = pvVar5;
  msg_78.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_78,(size_t)&local_ed8,
             msg_78);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/13");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd8fb;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x119,(CSubNet *)&local_d0,"\"1.0.0.0/13\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.240.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_ee8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_ee0 = "";
  local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_79.m_end = (iterator)0x11b;
  file_79.m_begin = (iterator)&local_ee8;
  msg_79.m_end = pvVar5;
  msg_79.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_79,(size_t)&local_ef8,
             msg_79);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/12");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd927;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x11b,(CSubNet *)&local_d0,"\"1.0.0.0/12\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.224.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_f08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f00 = "";
  local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_80.m_end = (iterator)0x11d;
  file_80.m_begin = (iterator)&local_f08;
  msg_80.m_end = pvVar5;
  msg_80.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_80,(size_t)&local_f18,
             msg_80);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/11");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd953;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x11d,(CSubNet *)&local_d0,"\"1.0.0.0/11\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.192.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_f28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f20 = "";
  local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f30 = &boost::unit_test::basic_cstring<char_const>::null;
  file_81.m_end = (iterator)0x11f;
  file_81.m_begin = (iterator)&local_f28;
  msg_81.m_end = pvVar5;
  msg_81.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_81,(size_t)&local_f38,
             msg_81);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/10");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd97f;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013af6f0;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x11f,(CSubNet *)&local_d0,"\"1.0.0.0/10\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.128.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_f48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f40 = "";
  local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_82.m_end = (iterator)0x121;
  file_82.m_begin = (iterator)&local_f48;
  msg_82.m_end = pvVar5;
  msg_82.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_82,(size_t)&local_f58,
             msg_82);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/9");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd9ab;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x121,(CSubNet *)&local_d0,"\"1.0.0.0/9\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_f68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f60 = "";
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_83.m_end = (iterator)0x123;
  file_83.m_begin = (iterator)&local_f68;
  msg_83.m_end = pvVar5;
  msg_83.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_83,(size_t)&local_f78,
             msg_83);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1.0.0.0/8");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd2d6;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x123,(CSubNet *)&local_d0,"\"1.0.0.0/8\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/254.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_f88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_f80 = "";
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_84.m_end = (iterator)0x125;
  file_84.m_begin = (iterator)&local_f88;
  msg_84.m_end = pvVar5;
  msg_84.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_84,(size_t)&local_f98,
             msg_84);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/7");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd9e5;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x125,(CSubNet *)&local_d0,"\"0.0.0.0/7\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/252.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_fa8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fa0 = "";
  local_fb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fb0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_85.m_end = (iterator)0x127;
  file_85.m_begin = (iterator)&local_fa8;
  msg_85.m_end = pvVar5;
  msg_85.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_85,(size_t)&local_fb8,
             msg_85);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/6");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebda0d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x127,(CSubNet *)&local_d0,"\"0.0.0.0/6\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/248.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_fc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fc0 = "";
  local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_86.m_end = (iterator)0x129;
  file_86.m_begin = (iterator)&local_fc8;
  msg_86.m_end = pvVar5;
  msg_86.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_86,(size_t)&local_fd8,
             msg_86);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/5");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebda35;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x129,(CSubNet *)&local_d0,"\"0.0.0.0/5\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/240.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_fe8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_fe0 = "";
  local_ff8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ff0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_87.m_end = (iterator)0x12b;
  file_87.m_begin = (iterator)&local_fe8;
  msg_87.m_end = pvVar5;
  msg_87.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_87,(size_t)&local_ff8,
             msg_87);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/4");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebda5d;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,299,(CSubNet *)&local_d0,"\"0.0.0.0/4\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/224.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1008 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1000 = "";
  local_1018 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1010 = &boost::unit_test::basic_cstring<char_const>::null;
  file_88.m_end = (iterator)0x12d;
  file_88.m_begin = (iterator)&local_1008;
  msg_88.m_end = pvVar5;
  msg_88.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_88,(size_t)&local_1018,
             msg_88);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/3");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebda85;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x12d,(CSubNet *)&local_d0,"\"0.0.0.0/3\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/192.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1028 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1020 = "";
  local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
  file_89.m_end = (iterator)0x12f;
  file_89.m_begin = (iterator)&local_1028;
  msg_89.m_end = pvVar5;
  msg_89.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_89,(size_t)&local_1038,
             msg_89);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/2");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebdaad;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x12f,(CSubNet *)&local_d0,"\"0.0.0.0/2\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/128.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1048 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1040 = "";
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
  file_90.m_end = (iterator)0x131;
  file_90.m_begin = (iterator)&local_1048;
  msg_90.m_end = pvVar5;
  msg_90.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_90,(size_t)&local_1058,
             msg_90);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/1");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebdad5;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x131,(CSubNet *)&local_d0,"\"0.0.0.0/1\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/0.0.0.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1068 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1060 = "";
  local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1070 = &boost::unit_test::basic_cstring<char_const>::null;
  file_91.m_end = (iterator)0x133;
  file_91.m_begin = (iterator)&local_1068;
  msg_91.m_end = pvVar5;
  msg_91.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_91,(size_t)&local_1078,
             msg_91);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"0.0.0.0/0");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebce5b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae8d8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x133,(CSubNet *)&local_d0,"\"0.0.0.0/0\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1:2:3:4:5:6:7:8/ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1088 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1080 = "";
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  file_92.m_end = (iterator)0x136;
  file_92.m_begin = (iterator)&local_1088;
  msg_92.m_end = pvVar5;
  msg_92.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_92,(size_t)&local_1098,
             msg_92);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1:2:3:4:5:6:7:8/128");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebd122;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013b0dc8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x136,(CSubNet *)&local_d0,"\"1:2:3:4:5:6:7:8/128\"",
             (string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1:2:3:4:5:6:7:8/ffff:0000:0000:0000:0000:0000:0000:0000","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_10a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10a0 = "";
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_93.m_end = (iterator)0x138;
  file_93.m_begin = (iterator)&local_10a8;
  msg_93.m_end = pvVar5;
  msg_93.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_93,(size_t)&local_10b8,
             msg_93);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"1::/16");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebdb6b;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae188;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x138,(CSubNet *)&local_d0,"\"1::/16\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1:2:3:4:5:6:7:8/0000:0000:0000:0000:0000:0000:0000:0000","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_10c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10c0 = "";
  local_10d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_94.m_end = (iterator)0x13a;
  file_94.m_begin = (iterator)&local_10c8;
  msg_94.m_end = pvVar5;
  msg_94.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_94,(size_t)&local_10d8,
             msg_94);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae088;
  aStack_100._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_100._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  CSubNet::ToString_abi_cxx11_((string *)local_130,(CSubNet *)&local_98.indirect_contents);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((string *)local_130,"::/0");
  local_150[0] = iVar3 == 0;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_170._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_170.m_message.px = (element_type *)0xebb7fc;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c0._8_8_ = &local_180;
  local_158 = (string *)0xebcd89;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae998;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_158;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_180 = (string *)local_130;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_150,(lazy_ostream *)&local_110,1,2,REQUIRE,0xebf366,
             (size_t)&local_170,0x13a,(CSubNet *)&local_d0,"\"::/0\"",(string *)&local_58);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != &aStack_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(aStack_120._M_allocated_capacity + 1));
  }
  local_58.indirect_contents.indirect = (char *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.255.232.0","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.indirect_contents.indirect != &aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_10e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_10e0 = "";
  local_10f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_95.m_end = (iterator)0x13d;
  file_95.m_begin = (iterator)&local_10e8;
  msg_95.m_end = pvVar5;
  msg_95.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_95,(size_t)&local_10f8,
             msg_95);
  _cVar6 = 0x4e6cac;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_58.direct[0] = !bVar2;
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!subnet.IsValid()";
  local_110._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1100 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_c0._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)&local_d0,1,0,WARN,_cVar6,
             (size_t)&local_1108,0x13d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48);
  local_58.indirect_contents.indirect = (char *)(shared_count *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1.2.3.4/255.0.255.255","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((shared_count *)local_58.indirect_contents.indirect != (shared_count *)&aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1110 = "";
  local_1128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_96.m_end = (iterator)0x13f;
  file_96.m_begin = (iterator)&local_1118;
  msg_96.m_end = pvVar5;
  msg_96.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_96,(size_t)&local_1128,
             msg_96);
  _cVar6 = 0x4e6e4d;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_58.direct[0] = !bVar2;
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!subnet.IsValid()";
  local_110._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1130 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_c0._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)&local_d0,1,0,WARN,_cVar6,
             (size_t)&local_1138,0x13f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48);
  local_58.indirect_contents.indirect = (char *)(shared_count *)&aStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1:2:3:4:5:6:7:8/ffff:ffff:ffff:fffe:ffff:ffff:ffff:ff0f","");
  LookupSubNet((CSubNet *)&local_d0,(string *)&local_58);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  local_98._8_8_ = CONCAT71(local_d0._9_7_,local_d0.direct[8]);
  local_98.indirect_contents.indirect = local_d0.indirect_contents.indirect;
  local_88 = local_c0._M_allocated_capacity._0_4_;
  local_c0._M_allocated_capacity = local_c0._M_allocated_capacity & 0xffffffff00000000;
  local_80 = (lazy_ostream *)local_c0._8_8_;
  local_68 = local_a0;
  local_78[0] = local_b0[0];
  local_78[1] = local_b0[1];
  local_78[2] = local_b0[2];
  local_78[3] = local_b0[3];
  local_78[4] = local_b0[4];
  local_78[5] = local_b0[5];
  local_78[6] = local_b0[6];
  local_78[7] = local_b0[7];
  auStack_70[0] = auStack_a8[0];
  auStack_70[1] = auStack_a8[1];
  auStack_70[2] = auStack_a8[2];
  auStack_70[3] = auStack_a8[3];
  auStack_70[4] = auStack_a8[4];
  auStack_70[5] = auStack_a8[5];
  auStack_70[6] = auStack_a8[6];
  auStack_70[7] = auStack_a8[7];
  if ((shared_count *)local_58.indirect_contents.indirect != (shared_count *)&aStack_48) {
    operator_delete(local_58.indirect_contents.indirect,(ulong)(aStack_48._M_allocated_capacity + 1)
                   );
  }
  local_1148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1140 = "";
  local_1158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_97.m_end = (iterator)0x141;
  file_97.m_begin = (iterator)&local_1148;
  msg_97.m_end = pvVar5;
  msg_97.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_97,(size_t)&local_1158,
             msg_97);
  _cVar6 = 0x4e6fe0;
  bVar2 = CSubNet::IsValid((CSubNet *)&local_98.indirect_contents);
  local_58.direct[0] = !bVar2;
  local_58._8_8_ = 0;
  aStack_48._M_allocated_capacity = 0;
  local_110.indirect_contents.indirect = "!subnet.IsValid()";
  local_110._8_8_ = (long)"!subnet.IsValid()" + 0x11;
  local_d0.direct[8] = '\0';
  local_d0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_c0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_1160 = "";
  local_c0._8_8_ = (lazy_ostream *)&local_110;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)&local_d0,1,0,WARN,_cVar6,
             (size_t)&local_1168,0x141);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48);
  if (0x10 < (uint)aStack_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
  }
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(subnet_test)
{

    BOOST_CHECK(LookupSubNet("1.2.3.0/24") == LookupSubNet("1.2.3.0/255.255.255.0"));
    BOOST_CHECK(LookupSubNet("1.2.3.0/24") != LookupSubNet("1.2.4.0/255.255.255.0"));
    BOOST_CHECK(LookupSubNet("1.2.3.0/24").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("1.2.2.0/24").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(LookupSubNet("1.2.3.4").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(LookupSubNet("1.2.3.4/32").Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("1.2.3.4").Match(ResolveIP("5.6.7.8")));
    BOOST_CHECK(!LookupSubNet("1.2.3.4/32").Match(ResolveIP("5.6.7.8")));
    BOOST_CHECK(LookupSubNet("::ffff:127.0.0.1").Match(ResolveIP("127.0.0.1")));
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8").Match(ResolveIP("1:2:3:4:5:6:7:8")));
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8").Match(ResolveIP("1:2:3:4:5:6:7:9")));
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:0/112").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    BOOST_CHECK(LookupSubNet("192.168.0.1/24").Match(ResolveIP("192.168.0.2")));
    BOOST_CHECK(LookupSubNet("192.168.0.20/29").Match(ResolveIP("192.168.0.18")));
    BOOST_CHECK(LookupSubNet("1.2.2.1/24").Match(ResolveIP("1.2.2.4")));
    BOOST_CHECK(LookupSubNet("1.2.2.110/31").Match(ResolveIP("1.2.2.111")));
    BOOST_CHECK(LookupSubNet("1.2.2.20/26").Match(ResolveIP("1.2.2.63")));
    // All-Matching IPv6 Matches arbitrary IPv6
    BOOST_CHECK(LookupSubNet("::/0").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    // But not `::` or `0.0.0.0` because they are considered invalid addresses
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("::")));
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("0.0.0.0")));
    // Addresses from one network (IPv4) don't belong to subnets of another network (IPv6)
    BOOST_CHECK(!LookupSubNet("::/0").Match(ResolveIP("1.2.3.4")));
    // All-Matching IPv4 does not Match IPv6
    BOOST_CHECK(!LookupSubNet("0.0.0.0/0").Match(ResolveIP("1:2:3:4:5:6:7:1234")));
    // Invalid subnets Match nothing (not even invalid addresses)
    BOOST_CHECK(!CSubNet().Match(ResolveIP("1.2.3.4")));
    BOOST_CHECK(!LookupSubNet("").Match(ResolveIP("4.5.6.7")));
    BOOST_CHECK(!LookupSubNet("bloop").Match(ResolveIP("0.0.0.0")));
    BOOST_CHECK(!LookupSubNet("bloop").Match(ResolveIP("hab")));
    // Check valid/invalid
    BOOST_CHECK(LookupSubNet("1.2.3.0/0").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/-1").IsValid());
    BOOST_CHECK(LookupSubNet("1.2.3.0/32").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/33").IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/300").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/0").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/33").IsValid());
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8/-1").IsValid());
    BOOST_CHECK(LookupSubNet("1:2:3:4:5:6:7:8/128").IsValid());
    BOOST_CHECK(!LookupSubNet("1:2:3:4:5:6:7:8/129").IsValid());
    BOOST_CHECK(!LookupSubNet("fuzzy").IsValid());

    //CNetAddr constructor test
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).IsValid());
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).Match(ResolveIP("127.0.0.1")));
    BOOST_CHECK(!CSubNet(ResolveIP("127.0.0.1")).Match(ResolveIP("127.0.0.2")));
    BOOST_CHECK(CSubNet(ResolveIP("127.0.0.1")).ToString() == "127.0.0.1/32");

    CSubNet subnet = CSubNet(ResolveIP("1.2.3.4"), 32);
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = CSubNet(ResolveIP("1.2.3.4"), 8);
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = CSubNet(ResolveIP("1.2.3.4"), 0);
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("255.255.255.255"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("255.0.0.0"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = CSubNet(ResolveIP("1.2.3.4"), ResolveIP("0.0.0.0"));
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).IsValid());
    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).Match(ResolveIP("1:2:3:4:5:6:7:8")));
    BOOST_CHECK(!CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).Match(ResolveIP("1:2:3:4:5:6:7:9")));
    BOOST_CHECK(CSubNet(ResolveIP("1:2:3:4:5:6:7:8")).ToString() == "1:2:3:4:5:6:7:8/128");
    // IPv4 address with IPv6 netmask or the other way around.
    BOOST_CHECK(!CSubNet(ResolveIP("1.1.1.1"), ResolveIP("ffff::")).IsValid());
    BOOST_CHECK(!CSubNet(ResolveIP("::1"), ResolveIP("255.0.0.0")).IsValid());

    // Create Non-IP subnets.

    const CNetAddr tor_addr{
        ResolveIP("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion")};

    subnet = CSubNet(tor_addr);
    BOOST_CHECK(subnet.IsValid());
    BOOST_CHECK_EQUAL(subnet.ToString(), tor_addr.ToStringAddr());
    BOOST_CHECK(subnet.Match(tor_addr));
    BOOST_CHECK(
        !subnet.Match(ResolveIP("kpgvmscirrdqpekbqjsvw5teanhatztpp2gl6eee4zkowvwfxwenqaid.onion")));
    BOOST_CHECK(!subnet.Match(ResolveIP("1.2.3.4")));

    BOOST_CHECK(!CSubNet(tor_addr, 200).IsValid());
    BOOST_CHECK(!CSubNet(tor_addr, ResolveIP("255.0.0.0")).IsValid());

    subnet = LookupSubNet("1.2.3.4/255.255.255.255");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/32");
    subnet = LookupSubNet("1.2.3.4/255.255.255.254");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/31");
    subnet = LookupSubNet("1.2.3.4/255.255.255.252");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.4/30");
    subnet = LookupSubNet("1.2.3.4/255.255.255.248");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/29");
    subnet = LookupSubNet("1.2.3.4/255.255.255.240");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/28");
    subnet = LookupSubNet("1.2.3.4/255.255.255.224");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/27");
    subnet = LookupSubNet("1.2.3.4/255.255.255.192");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/26");
    subnet = LookupSubNet("1.2.3.4/255.255.255.128");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/25");
    subnet = LookupSubNet("1.2.3.4/255.255.255.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.3.0/24");
    subnet = LookupSubNet("1.2.3.4/255.255.254.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.2.0/23");
    subnet = LookupSubNet("1.2.3.4/255.255.252.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/22");
    subnet = LookupSubNet("1.2.3.4/255.255.248.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/21");
    subnet = LookupSubNet("1.2.3.4/255.255.240.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/20");
    subnet = LookupSubNet("1.2.3.4/255.255.224.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/19");
    subnet = LookupSubNet("1.2.3.4/255.255.192.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/18");
    subnet = LookupSubNet("1.2.3.4/255.255.128.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/17");
    subnet = LookupSubNet("1.2.3.4/255.255.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/16");
    subnet = LookupSubNet("1.2.3.4/255.254.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.2.0.0/15");
    subnet = LookupSubNet("1.2.3.4/255.252.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/14");
    subnet = LookupSubNet("1.2.3.4/255.248.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/13");
    subnet = LookupSubNet("1.2.3.4/255.240.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/12");
    subnet = LookupSubNet("1.2.3.4/255.224.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/11");
    subnet = LookupSubNet("1.2.3.4/255.192.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/10");
    subnet = LookupSubNet("1.2.3.4/255.128.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/9");
    subnet = LookupSubNet("1.2.3.4/255.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1.0.0.0/8");
    subnet = LookupSubNet("1.2.3.4/254.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/7");
    subnet = LookupSubNet("1.2.3.4/252.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/6");
    subnet = LookupSubNet("1.2.3.4/248.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/5");
    subnet = LookupSubNet("1.2.3.4/240.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/4");
    subnet = LookupSubNet("1.2.3.4/224.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/3");
    subnet = LookupSubNet("1.2.3.4/192.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/2");
    subnet = LookupSubNet("1.2.3.4/128.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/1");
    subnet = LookupSubNet("1.2.3.4/0.0.0.0");
    BOOST_CHECK_EQUAL(subnet.ToString(), "0.0.0.0/0");

    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:ffff:ffff:ffff:ffff:ffff:ffff:ffff");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1:2:3:4:5:6:7:8/128");
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:0000:0000:0000:0000:0000:0000:0000");
    BOOST_CHECK_EQUAL(subnet.ToString(), "1::/16");
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/0000:0000:0000:0000:0000:0000:0000:0000");
    BOOST_CHECK_EQUAL(subnet.ToString(), "::/0");
    // Invalid netmasks (with 1-bits after 0-bits)
    subnet = LookupSubNet("1.2.3.4/255.255.232.0");
    BOOST_CHECK(!subnet.IsValid());
    subnet = LookupSubNet("1.2.3.4/255.0.255.255");
    BOOST_CHECK(!subnet.IsValid());
    subnet = LookupSubNet("1:2:3:4:5:6:7:8/ffff:ffff:ffff:fffe:ffff:ffff:ffff:ff0f");
    BOOST_CHECK(!subnet.IsValid());
}